

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::MergeUsingImpl
          (Parser *this,ZeroCopyInputStream *param_1,Message *output,ParserImpl *parser_impl)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ParserImpl *delim;
  size_type *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_fields;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  delim = parser_impl;
  while ((parser_impl->tokenizer_).current_.type != TYPE_END) {
    bVar1 = ParserImpl::ConsumeField(parser_impl,output);
    if (!bVar1) {
      return false;
    }
  }
  if (parser_impl->had_errors_ != false) {
    return false;
  }
  if (this->allow_partial_ == false) {
    iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[8])(output);
    if ((char)iVar2 == '\0') {
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Message::FindInitializationErrors(output,&local_38);
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_58,(protobuf *)&local_38,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x61947c,(char *)delim);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x623012);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_78.field_2._M_allocated_capacity = *psVar4;
        local_78.field_2._8_8_ = plVar3[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar4;
        local_78._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_78._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ParserImpl::ReportError(parser_impl,-1,0,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool TextFormat::Parser::MergeUsingImpl(io::ZeroCopyInputStream* /* input */,
                                        Message* output,
                                        ParserImpl* parser_impl) {
  if (!parser_impl->Parse(output)) return false;
  if (!allow_partial_ && !output->IsInitialized()) {
    std::vector<string> missing_fields;
    output->FindInitializationErrors(&missing_fields);
    parser_impl->ReportError(-1, 0, "Message missing required fields: " +
                                        Join(missing_fields, ", "));
    return false;
  }
  return true;
}